

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<int,std::allocator<int>>>
          (Attribute *this,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  pointer piVar2;
  optional<std::vector<int,_std::allocator<int>_>_> local_30;
  
  if ((v != (vector<int,_std::allocator<int>_> *)0x0) &&
     (primvar::PrimVar::get_value<std::vector<int,std::allocator<int>>>(&local_30,&this->_var),
     local_30.has_value_ == true)) {
    piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_30.contained.data._0_8_;
    (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_30.contained._8_8_;
    (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_30.contained._16_8_;
    if (piVar1 == (pointer)0x0) {
      return true;
    }
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }